

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

void __thiscall
adios2::core::IO::SetTransportParameter(IO *this,size_t transportIndex,string *key,string *value)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  char cVar10;
  ScopedTimer __var2310;
  string __str;
  ScopedTimer local_100;
  string *local_f8;
  char *local_f0;
  uint local_e8;
  char local_e0 [16];
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  if ((SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)::__var310 ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)
                                   ::__var310), iVar3 != 0)) {
    SetTransportParameter::__var310 = (void *)ps_timer_create_("IO::other");
    __cxa_guard_release(&SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)
                         ::__var310);
  }
  local_100.m_timer = SetTransportParameter::__var310;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  uVar6 = ((long)(this->m_TransportsParameters).
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_TransportsParameters).
                 super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar6 < transportIndex || uVar6 - transportIndex == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Core","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"IO","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SetTransportParameter","");
    cVar10 = '\x01';
    if (9 < transportIndex) {
      sVar7 = transportIndex;
      cVar2 = '\x04';
      do {
        cVar10 = cVar2;
        if (sVar7 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00373960;
        }
        if (sVar7 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00373960;
        }
        if (sVar7 < 10000) goto LAB_00373960;
        bVar1 = 99999 < sVar7;
        sVar7 = sVar7 / 10000;
        cVar2 = cVar10 + '\x04';
      } while (bVar1);
      cVar10 = cVar10 + '\x01';
    }
LAB_00373960:
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_f0,local_e8,transportIndex);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x74d593);
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_f8 = key;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar9 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_70.field_2._M_allocated_capacity = *psVar9;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar9;
      local_70._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    helper::Throw<std::invalid_argument>(&local_50,&local_b0,&local_d0,&local_70,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    key = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      key = local_f8;
    }
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((this->m_TransportsParameters).
                        super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + transportIndex,key);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_100);
  return;
}

Assistant:

void IO::SetTransportParameter(const size_t transportIndex, const std::string key,
                               const std::string value)
{
    PERFSTUBS_SCOPED_TIMER("IO::other");
    if (transportIndex >= m_TransportsParameters.size())
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "SetTransportParameter",
                                             "transport Index " + std::to_string(transportIndex) +
                                                 " does not exist");
    }

    m_TransportsParameters[transportIndex][key] = value;
}